

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_UpdateGamepadButton
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerButton button_no)

{
  int iVar1;
  _SDL_GameController **pp_Var2;
  char cVar3;
  bool down;
  long lVar4;
  
  pp_Var2 = (bd->Gamepads).Data;
  iVar1 = (bd->Gamepads).Size;
  down = false;
  for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
    cVar3 = SDL_GameControllerGetButton(*(undefined8 *)((long)pp_Var2 + lVar4),button_no);
    down = (bool)(down | cVar3 != '\0');
  }
  ImGuiIO::AddKeyEvent(io,key,down);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadButton(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerButton button_no)
{
    bool merged_value = false;
    for (SDL_GameController* gamepad : bd->Gamepads)
        merged_value |= SDL_GameControllerGetButton(gamepad, button_no) != 0;
    io.AddKeyEvent(key, merged_value);
}